

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Dropout_x86_avx::forward_inplace(Dropout_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [12];
  long lVar11;
  long lVar12;
  undefined1 (*pauVar13) [32];
  undefined1 (*pauVar14) [12];
  long *in_RSI;
  long in_RDI;
  __m128 _p_5;
  int i_5;
  float *ptr_5;
  int q_1;
  __m128 _p_4;
  int j_1;
  float *ptr_4;
  int i_4;
  __m128 _p_3;
  float *ptr_3;
  int i_3;
  __m128 _scale_1;
  int size_1;
  int channels_1;
  int h_1;
  int w_1;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q;
  __m256 _p_1;
  int j;
  float *ptr_1;
  int i_1;
  __m256 _p;
  float *ptr;
  int i;
  __m256 _scale;
  int size;
  int channels;
  int h;
  int w;
  int elempack;
  int dims;
  Mat *m_1;
  Mat *m;
  float fStackY_714;
  int local_70c;
  Option *in_stack_fffffffffffff928;
  Mat *in_stack_fffffffffffff930;
  Dropout *in_stack_fffffffffffff938;
  undefined1 (*local_6c0) [12];
  int local_6b4;
  float fStack_6a4;
  int local_694;
  undefined1 (*local_690) [12];
  int local_684;
  float fStack_674;
  int local_664;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  int local_608;
  undefined1 (*local_5b0) [32];
  int local_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  int local_574;
  undefined1 (*local_570) [32];
  int local_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  int local_524;
  int local_4c0;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined4 uStack_444;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined4 uStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  float local_250;
  float fStack_24c;
  float fStack_248;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float local_210;
  float fStack_20c;
  float fStack_208;
  
  if ((*(float *)(in_RDI + 0xd0) != 1.0) || (NAN(*(float *)(in_RDI + 0xd0)))) {
    iVar3 = (int)in_RSI[5];
    if ((int)in_RSI[3] == 8) {
      iVar4 = *(int *)((long)in_RSI + 0x2c);
      lVar11 = in_RSI[6];
      lVar12 = in_RSI[7];
      uVar1 = *(uint *)(in_RDI + 0xd0);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      local_400 = auVar6._0_4_;
      fStack_3fc = auVar6._4_4_;
      fStack_3f8 = auVar6._8_4_;
      fStack_3f4 = auVar6._12_4_;
      fStack_3f0 = auVar5._0_4_;
      fStack_3ec = auVar5._4_4_;
      fStack_3e8 = auVar5._8_4_;
      if (iVar3 == 1) {
        for (local_524 = 0; local_524 < iVar4; local_524 = local_524 + 1) {
          pauVar13 = (undefined1 (*) [32])(*in_RSI + (long)(local_524 << 3) * 4);
          local_3e0 = (float)*(undefined8 *)*pauVar13;
          fStack_3dc = (float)((ulong)*(undefined8 *)*pauVar13 >> 0x20);
          fStack_3d8 = (float)*(undefined8 *)(*pauVar13 + 8);
          fStack_3d4 = (float)((ulong)*(undefined8 *)(*pauVar13 + 8) >> 0x20);
          fStack_3d0 = (float)*(undefined8 *)(*pauVar13 + 0x10);
          fStack_3cc = (float)((ulong)*(undefined8 *)(*pauVar13 + 0x10) >> 0x20);
          fStack_3c8 = (float)*(undefined8 *)(*pauVar13 + 0x18);
          uStack_3c4 = (undefined4)((ulong)*(undefined8 *)(*pauVar13 + 0x18) >> 0x20);
          local_560 = CONCAT44(fStack_3dc * fStack_3fc,local_3e0 * local_400);
          uStack_558 = CONCAT44(fStack_3d4 * fStack_3f4,fStack_3d8 * fStack_3f8);
          uStack_550 = CONCAT44(fStack_3cc * fStack_3ec,fStack_3d0 * fStack_3f0);
          uStack_548 = CONCAT44(uStack_3c4,fStack_3c8 * fStack_3e8);
          auVar9._8_8_ = uStack_558;
          auVar9._0_8_ = local_560;
          auVar9._16_8_ = uStack_550;
          auVar9._24_8_ = uStack_548;
          *pauVar13 = auVar9;
        }
      }
      if (iVar3 == 2) {
        for (local_564 = 0; local_564 < (int)lVar11; local_564 = local_564 + 1) {
          local_570 = (undefined1 (*) [32])
                      (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_564 * in_RSI[2]);
          for (local_574 = 0; local_574 < iVar4; local_574 = local_574 + 1) {
            local_420 = (float)*(undefined8 *)*local_570;
            fStack_41c = (float)((ulong)*(undefined8 *)*local_570 >> 0x20);
            fStack_418 = (float)*(undefined8 *)(*local_570 + 8);
            fStack_414 = (float)((ulong)*(undefined8 *)(*local_570 + 8) >> 0x20);
            fStack_410 = (float)*(undefined8 *)(*local_570 + 0x10);
            fStack_40c = (float)((ulong)*(undefined8 *)(*local_570 + 0x10) >> 0x20);
            fStack_408 = (float)*(undefined8 *)(*local_570 + 0x18);
            uStack_404 = (undefined4)((ulong)*(undefined8 *)(*local_570 + 0x18) >> 0x20);
            local_5a0 = CONCAT44(fStack_41c * fStack_3fc,local_420 * local_400);
            uStack_598 = CONCAT44(fStack_414 * fStack_3f4,fStack_418 * fStack_3f8);
            uStack_590 = CONCAT44(fStack_40c * fStack_3ec,fStack_410 * fStack_3f0);
            uStack_588 = CONCAT44(uStack_404,fStack_408 * fStack_3e8);
            auVar8._8_8_ = uStack_598;
            auVar8._0_8_ = local_5a0;
            auVar8._16_8_ = uStack_590;
            auVar8._24_8_ = uStack_588;
            *local_570 = auVar8;
            local_570 = local_570 + 1;
          }
        }
      }
      if (iVar3 == 3) {
        for (local_5a4 = 0; local_5a4 < (int)lVar12; local_5a4 = local_5a4 + 1) {
          local_5b0 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_5a4 * in_RSI[2]);
          for (local_608 = 0; local_608 < iVar4 * (int)lVar11; local_608 = local_608 + 1) {
            local_460 = (float)*(undefined8 *)*local_5b0;
            fStack_45c = (float)((ulong)*(undefined8 *)*local_5b0 >> 0x20);
            fStack_458 = (float)*(undefined8 *)(*local_5b0 + 8);
            fStack_454 = (float)((ulong)*(undefined8 *)(*local_5b0 + 8) >> 0x20);
            fStack_450 = (float)*(undefined8 *)(*local_5b0 + 0x10);
            fStack_44c = (float)((ulong)*(undefined8 *)(*local_5b0 + 0x10) >> 0x20);
            fStack_448 = (float)*(undefined8 *)(*local_5b0 + 0x18);
            uStack_444 = (undefined4)((ulong)*(undefined8 *)(*local_5b0 + 0x18) >> 0x20);
            local_640 = CONCAT44(fStack_45c * fStack_3fc,local_460 * local_400);
            uStack_638 = CONCAT44(fStack_454 * fStack_3f4,fStack_458 * fStack_3f8);
            uStack_630 = CONCAT44(fStack_44c * fStack_3ec,fStack_450 * fStack_3f0);
            uStack_628 = CONCAT44(uStack_444,fStack_448 * fStack_3e8);
            auVar7._8_8_ = uStack_638;
            auVar7._0_8_ = local_640;
            auVar7._16_8_ = uStack_630;
            auVar7._24_8_ = uStack_628;
            *local_5b0 = auVar7;
            local_5b0 = local_5b0 + 1;
          }
        }
      }
      local_4c0 = 0;
    }
    else if ((int)in_RSI[3] == 4) {
      iVar4 = *(int *)((long)in_RSI + 0x2c);
      lVar11 = in_RSI[6];
      lVar12 = in_RSI[7];
      fVar2 = *(float *)(in_RDI + 0xd0);
      if (iVar3 == 1) {
        for (local_664 = 0; local_664 < iVar4; local_664 = local_664 + 1) {
          pauVar14 = (undefined1 (*) [12])(*in_RSI + (long)(local_664 << 2) * 4);
          auVar10 = *pauVar14;
          fStack_674 = (float)((ulong)*(undefined8 *)(*pauVar14 + 8) >> 0x20);
          local_210 = auVar10._0_4_;
          fStack_20c = auVar10._4_4_;
          fStack_208 = auVar10._8_4_;
          *(ulong *)*pauVar14 = CONCAT44(fStack_20c * fVar2,local_210 * fVar2);
          *(ulong *)(*pauVar14 + 8) = CONCAT44(fStack_674 * fVar2,fStack_208 * fVar2);
        }
      }
      if (iVar3 == 2) {
        for (local_684 = 0; local_684 < (int)lVar11; local_684 = local_684 + 1) {
          local_690 = (undefined1 (*) [12])
                      (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_684 * in_RSI[2]);
          for (local_694 = 0; local_694 < iVar4; local_694 = local_694 + 1) {
            auVar10 = *local_690;
            fStack_6a4 = (float)((ulong)*(undefined8 *)(*local_690 + 8) >> 0x20);
            local_230 = auVar10._0_4_;
            fStack_22c = auVar10._4_4_;
            fStack_228 = auVar10._8_4_;
            *(ulong *)*local_690 = CONCAT44(fStack_22c * fVar2,local_230 * fVar2);
            *(ulong *)(*local_690 + 8) = CONCAT44(fStack_6a4 * fVar2,fStack_228 * fVar2);
            local_690 = (undefined1 (*) [12])(local_690[1] + 4);
          }
        }
      }
      if (iVar3 == 3) {
        for (local_6b4 = 0; local_6b4 < (int)lVar12; local_6b4 = local_6b4 + 1) {
          local_6c0 = (undefined1 (*) [12])(*in_RSI + in_RSI[8] * (long)local_6b4 * in_RSI[2]);
          for (local_70c = 0; local_70c < iVar4 * (int)lVar11; local_70c = local_70c + 1) {
            auVar10 = *local_6c0;
            fStackY_714 = (float)((ulong)*(undefined8 *)(*local_6c0 + 8) >> 0x20);
            local_250 = auVar10._0_4_;
            fStack_24c = auVar10._4_4_;
            fStack_248 = auVar10._8_4_;
            *(ulong *)*local_6c0 = CONCAT44(fStack_24c * fVar2,local_250 * fVar2);
            *(ulong *)(*local_6c0 + 8) = CONCAT44(fStackY_714 * fVar2,fStack_248 * fVar2);
            local_6c0 = (undefined1 (*) [12])(local_6c0[1] + 4);
          }
        }
      }
      local_4c0 = 0;
    }
    else {
      local_4c0 = Dropout::forward_inplace
                            (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                             in_stack_fffffffffffff928);
    }
  }
  else {
    local_4c0 = 0;
  }
  return local_4c0;
}

Assistant:

int Dropout_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}